

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

CppType google::protobuf::internal::GetCppType<absl::lts_20250127::Cord>(void)

{
  return CPPTYPE_STRING;
}

Assistant:

constexpr FieldDescriptor::CppType GetCppType() {
  if constexpr (IsRepeatedT<T>) {
    return GetCppType<typename T::value_type>();
  } else {
    if (std::is_same_v<T, int32_t>) return FieldDescriptor::CPPTYPE_INT32;
    if (std::is_same_v<T, int64_t>) return FieldDescriptor::CPPTYPE_INT64;
    if (std::is_same_v<T, uint32_t>) return FieldDescriptor::CPPTYPE_UINT32;
    if (std::is_same_v<T, uint64_t>) return FieldDescriptor::CPPTYPE_UINT64;
    if (std::is_same_v<T, float>) return FieldDescriptor::CPPTYPE_FLOAT;
    if (std::is_same_v<T, double>) return FieldDescriptor::CPPTYPE_DOUBLE;
    if (std::is_same_v<T, bool>) return FieldDescriptor::CPPTYPE_BOOL;

    using PCV = std::remove_cv_t<std::remove_pointer_t<T>>;

    // strings
    if (std::is_same_v<PCV, internal::ArenaStringPtr> ||
        std::is_same_v<PCV, std::string> ||
        std::is_same_v<PCV, internal::MicroString> ||
        std::is_same_v<PCV, absl::Cord>) {
      return FieldDescriptor::CPPTYPE_STRING;
    }

    // messages
    if (std::is_same_v<PCV, Message> ||      //
        std::is_same_v<PCV, MessageLite> ||  //
        std::is_same_v<PCV, internal::LazyField>) {
      return FieldDescriptor::CPPTYPE_MESSAGE;
    }
  }

  // Return an invalid type to make the caller fail with a nice error message in
  // case we missed something.
  return FieldDescriptor::CppType{};
}